

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O3

string * __thiscall
pageAnalyzer::getInfoFromContent
          (string *__return_storage_ptr__,pageAnalyzer *this,string *keyToFindTarStr,int offset,
          int getMode,string *keyToFindPos,char endChar)

{
  char cVar1;
  int iVar2;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pbVar5 = (this->pageContent).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->pageContent).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar5) {
    uVar8 = 0;
  }
  else {
    lVar6 = 0;
    uVar8 = 0;
    do {
      lVar3 = std::__cxx11::string::find
                        ((char *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6),
                         (ulong)(keyToFindTarStr->_M_dataplus)._M_p,0);
      pbVar5 = (this->pageContent).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->pageContent).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (lVar3 != -1) break;
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar8 < (ulong)((long)pbVar4 - (long)pbVar5 >> 5));
  }
  if ((long)pbVar4 - (long)pbVar5 >> 5 != uVar8) {
    iVar7 = (int)uVar8 + offset;
    if (getMode == 0x12) {
      iVar2 = std::__cxx11::string::find
                        ((char *)(pbVar5 + iVar7),(ulong)(keyToFindPos->_M_dataplus)._M_p,0);
      lVar6 = (long)(iVar2 + (int)keyToFindPos->_M_string_length);
      if (lVar6 - keyToFindPos->_M_string_length != -1) {
        cVar1 = (this->pageContent).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_dataplus._M_p[lVar6];
        while (cVar1 != endChar) {
          lVar6 = lVar6 + 1;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          cVar1 = (this->pageContent).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_dataplus._M_p[lVar6];
        }
      }
    }
    else if (getMode == 0x11) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pageAnalyzer::getInfoFromContent(const std::string &keyToFindTarStr, int offset, int getMode, const std::string &keyToFindPos, char endChar)
{
    std::string result = std::string("");
    int pos = 0;
    for(; pos < this->pageContent.size(); pos++)
        if(this->pageContent[pos].find(keyToFindTarStr) != std::string::npos) break;
    if(pos == pageContent.size());
    else
    {
        pos += offset;
        if(getMode == GETMODE_ALL) result = this->pageContent[pos];
        else if(getMode == GETMODE_PART)
        {
            int startPos = this->pageContent[pos].find(keyToFindPos) + keyToFindPos.length();
            if(startPos - keyToFindPos.length() == std::string::npos);
            else
                for(int i = startPos; this->pageContent[pos][i] != endChar; i++)
                    result += this->pageContent[pos][i];
        }
    }
    return result;
}